

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::StdinStream::StdinStream(StdinStream *this,string *targetName)

{
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *targetName_local;
  StdinStream *this_local;
  
  local_18 = targetName;
  targetName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"file",&local_39);
  Stream::Stream((Stream *)
                 &(this->super_FileStream).super_FileDescriptorStream.super_DisconnectableStream.
                  field_0x1020,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"file:name=/dev/stdin;mode=read;fd=0",&local_71);
  FileStream::FileStream(&this->super_FileStream,&PTR_construction_vtable_24__00151958,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  (this->super_FileStream).super_FileDescriptorStream.super_DisconnectableStream.
  super_SelectableStream._vptr_SelectableStream = (_func_int **)0x1518c0;
  *(undefined8 *)
   &(this->super_FileStream).super_FileDescriptorStream.super_DisconnectableStream.field_0x1020 =
       0x151928;
  return;
}

Assistant:

explicit StdinStream(const string& targetName) :
			Stream("file"),
			FileStream("file:name=/dev/stdin;mode=read;fd=0") {}